

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O1

bool __thiscall brynet::net::EventLoop::linkChannel(EventLoop *this,sock fd,Channel *ptr)

{
  int iVar1;
  epoll_event ev;
  undefined1 local_10 [16];
  
  local_10._0_4_ = 0x80002001;
  local_10._4_8_ = ptr;
  iVar1 = epoll_ctl(this->mEpollFd,1,fd,(epoll_event *)local_10);
  return iVar1 == 0;
}

Assistant:

bool EventLoop::linkChannel(sock fd, Channel* ptr)
{
#ifdef PLATFORM_WINDOWS
    return CreateIoCompletionPort((HANDLE)fd, mIOCP, (ULONG_PTR)ptr, 0) != nullptr;
#else
    struct epoll_event ev = { 0, { 0 } };
    ev.events = EPOLLET | EPOLLIN | EPOLLRDHUP;
    ev.data.ptr = ptr;
    return epoll_ctl(mEpollFd, EPOLL_CTL_ADD, fd, &ev) == 0;
#endif
}